

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O1

float __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::getAttributeValueAsFloat
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this,int idx)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  float fNum;
  stringc c;
  istringstream sstr;
  allocator<char> local_1c5;
  float local_1c4;
  float local_1c0;
  undefined4 uStack_1bc;
  long local_1b0 [2];
  locale local_1a0 [8];
  string<char> local_198;
  istringstream local_188 [120];
  ios_base local_110 [264];
  
  iVar1 = (*(this->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                    (this,CONCAT44(in_register_00000034,idx));
  if ((char *)CONCAT44(extraout_var,iVar1) == (char *)0x0) {
    local_1c4 = 0.0;
  }
  else {
    local_198.array = (char *)0x0;
    local_198.allocated = 0;
    local_198.used = 0;
    core::string<char>::operator=(&local_198,(char *)CONCAT44(extraout_var,iVar1));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,local_198.array,&local_1c5);
    std::__cxx11::istringstream::istringstream(local_188,(string *)&local_1c0,_S_in);
    if ((long *)CONCAT44(uStack_1bc,local_1c0) != local_1b0) {
      operator_delete((long *)CONCAT44(uStack_1bc,local_1c0),local_1b0[0] + 1);
    }
    std::locale::locale((locale *)&local_1c0,"C");
    std::ios::imbue(local_1a0);
    std::locale::~locale(local_1a0);
    std::locale::~locale((locale *)&local_1c0);
    std::istream::_M_extract<float>((float *)local_188);
    local_1c4 = local_1c0;
    std::__cxx11::istringstream::~istringstream(local_188);
    std::ios_base::~ios_base(local_110);
    if (local_198.array != (char *)0x0) {
      operator_delete__(local_198.array);
    }
  }
  return local_1c4;
}

Assistant:

float getAttributeValueAsFloat(int idx) const
	{
		const char_type* attrvalue = getAttributeValue(idx);
		if (!attrvalue)
			return 0;

		core::stringc c = attrvalue;
		std::istringstream sstr(c.c_str());
		sstr.imbue(std::locale("C")); // Locale free number convert
		float fNum;
		sstr >> fNum;
		return fNum;
	}